

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llvm-dda-dump.cpp
# Opt level: O0

void dumpDefs(LLVMDataDependenceAnalysis *DDA,bool todot)

{
  bool bVar1;
  LLVMDataDependenceAnalysisOptions *pLVar2;
  byte in_SIL;
  LLVMDataDependenceAnalysis *in_RDI;
  Dumper dumper_1;
  MemorySSADumper dumper;
  MemorySSATransformation *SSA;
  undefined7 in_stack_ffffffffffffffc0;
  undefined1 in_stack_ffffffffffffffc7;
  LLVMDataDependenceAnalysis *in_stack_ffffffffffffffc8;
  MemorySSADumper *in_stack_ffffffffffffffd0;
  
  pLVar2 = dg::dda::LLVMDataDependenceAnalysis::getOptions(in_RDI);
  bVar1 = dg::DataDependenceAnalysisOptions::isSSA(&pLVar2->super_DataDependenceAnalysisOptions);
  if (bVar1) {
    dg::dda::LLVMDataDependenceAnalysis::getDDA((LLVMDataDependenceAnalysis *)0x15df98);
    dg::dda::DataDependenceAnalysis::getImpl((DataDependenceAnalysis *)0x15dfa0);
    bVar1 = llvm::cl::opt_storage::operator_cast_to_bool
                      ((opt_storage<bool,_false,_false> *)0x15dfb8);
    if (!bVar1) {
      dg::dda::MemorySSATransformation::computeAllDefinitions();
    }
    bVar1 = llvm::cl::opt_storage::operator_cast_to_bool
                      ((opt_storage<bool,_false,_false> *)0x15dfd9);
    if (!bVar1) {
      MemorySSADumper::MemorySSADumper
                (in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8,(bool)in_stack_ffffffffffffffc7
                );
      Dumper::dump((Dumper *)CONCAT17(in_stack_ffffffffffffffc7,in_stack_ffffffffffffffc0));
    }
  }
  else {
    Dumper::Dumper((Dumper *)&stack0xffffffffffffffb8,in_RDI,(bool)(in_SIL & 1));
    Dumper::dump((Dumper *)CONCAT17(in_stack_ffffffffffffffc7,in_stack_ffffffffffffffc0));
  }
  return;
}

Assistant:

static void dumpDefs(LLVMDataDependenceAnalysis *DDA, bool todot) {
    assert(DDA);

    if (DDA->getOptions().isSSA()) {
        auto *SSA = static_cast<MemorySSATransformation *>(
                DDA->getDDA()->getImpl());
        if (!graph_only)
            SSA->computeAllDefinitions();

        if (quiet)
            return;

        MemorySSADumper dumper(DDA, todot);
        dumper.dump();
    } else {
        Dumper dumper(DDA, todot);
        dumper.dump();
    }
}